

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Wasm::WasmBytecodeGenerator::EmitBrTable(WasmBytecodeGenerator *this)

{
  uint32 relativeDepth;
  uint uVar1;
  WasmBinaryReader *pWVar2;
  EmitInfoBase EVar3;
  bool bVar4;
  WasmBinaryReader *pWVar5;
  BlockInfo *this_00;
  BlockInfo *other;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar6;
  ulong uVar7;
  ulong uVar8;
  PolymorphicEmitInfo PVar9;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo polyExpr_00;
  PolymorphicEmitInfo expectedTypes;
  PolymorphicEmitInfo local_70;
  uint32 *local_60;
  EmitInfo local_58;
  EmitInfo scrutineeInfo;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 local_48;
  
  pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar6 = pWVar5;
  pWVar2 = pWVar5;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  uVar7 = (ulong)(pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar5 = (this->m_module->m_reader).ptr;
  }
  local_60 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
  relativeDepth = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
  local_70.count = 0;
  PolymorphicEmitInfo::Init(&local_70,(EmitInfo)0x1ffffffff);
  PVar9._4_4_ = 0;
  PVar9.count = local_70.count;
  PVar9.field_1.singleInfo = local_70.field_1.singleInfo;
  PVar9 = PopStackPolymorphic(this,PVar9,L"br_table expression must be of type i32");
  scrutineeInfo.super_EmitInfoBase.location = PVar9.count;
  local_58 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&scrutineeInfo,0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,0x29,(ulong)local_58 & 0xffffffff);
  scrutineeInfo.super_EmitInfoBase.location = 0;
  local_48.infos = (EmitInfo *)0x0;
  this_00 = GetBlockInfo(this,relativeDepth);
  uVar1 = (this_00->yieldInfo).count;
  expectedTypes._4_4_ = 0;
  expectedTypes.count = uVar1;
  if (uVar1 != 0) {
    expectedTypes.field_1.infos = (this_00->yieldInfo).field_1.infos;
    PVar9 = PopStackPolymorphic(this,expectedTypes,(char16 *)0x0);
    local_48 = PVar9.field_1;
    scrutineeInfo.super_EmitInfoBase.location = PVar9.count;
  }
  EVar3.location = scrutineeInfo.super_EmitInfoBase.location;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      other = GetBlockInfo(this,local_60[uVar8]);
      bVar4 = BlockInfo::IsEquivalent(this_00,other);
      if (!bVar4) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"br_table target %u signature mismatch");
        __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      polyExpr._4_4_ = 0;
      polyExpr.count = EVar3.location;
      polyExpr.field_1.infos = local_48.infos;
      YieldToBlock(this,other,polyExpr);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1b])
                (this->m_writer,0x2c,(ulong)(uint)other->label,(ulong)local_58 & 0xffffffff,
                 uVar8 & 0xffffffff);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  polyExpr_00._4_4_ = 0;
  polyExpr_00.count = scrutineeInfo.super_EmitInfoBase.location;
  polyExpr_00.field_1.infos = local_48.infos;
  YieldToBlock(this,this_00,polyExpr_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)this_00->label,0x2a);
  ReleaseLocation(this,&local_58);
  ReleaseLocation(this,(PolymorphicEmitInfo *)&scrutineeInfo);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBrTable()
{
    const uint32 numTargets = GetReader()->m_currentNode.brTable.numTargets;
    const uint32* targetTable = GetReader()->m_currentNode.brTable.targetTable;
    const uint32 defaultEntry = GetReader()->m_currentNode.brTable.defaultTarget;

    // Compile scrutinee
    EmitInfo scrutineeInfo = PopStackPolymorphic(EmitInfo(WasmTypes::I32), _u("br_table expression must be of type i32")).GetInfo(0);

    m_writer->AsmReg2(Js::OpCodeAsmJs::BeginSwitch_Int, scrutineeInfo.location, scrutineeInfo.location);
    PolymorphicEmitInfo yieldValue;
    BlockInfo* defaultBlockInfo = GetBlockInfo(defaultEntry);
    if (defaultBlockInfo->HasYield())
    {
        yieldValue = PopStackPolymorphic(defaultBlockInfo);
    }

    // Compile cases
    for (uint32 i = 0; i < numTargets; i++)
    {
        uint32 target = targetTable[i];
        BlockInfo* blockInfo = GetBlockInfo(target);
        if (!defaultBlockInfo->IsEquivalent(blockInfo))
        {
            throw WasmCompilationException(_u("br_table target %u signature mismatch"));
        }
        YieldToBlock(blockInfo, yieldValue);
        m_writer->AsmBrReg1Const1(Js::OpCodeAsmJs::Case_IntConst, blockInfo->label, scrutineeInfo.location, i);
    }

    YieldToBlock(defaultBlockInfo, yieldValue);
    m_writer->AsmBr(defaultBlockInfo->label, Js::OpCodeAsmJs::EndSwitch_Int);
    ReleaseLocation(&scrutineeInfo);
    ReleaseLocation(&yieldValue);

    SetUnreachableState(true);
}